

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O3

void make_glx_context_current_or_skip(Display *dpy)

{
  int iVar1;
  XVisualInfo *visinfo;
  Window WVar2;
  long lVar3;
  undefined8 extraout_RAX;
  Display *pDVar4;
  long lVar5;
  undefined8 uStack_50;
  Display *pDStack_48;
  
  visinfo = get_glx_visual(dpy);
  WVar2 = get_glx_window(dpy,visinfo,false);
  pDVar4 = dpy;
  lVar3 = (*_epoxy_glXCreateContext)(dpy,visinfo,0,1);
  if (lVar3 != 0) {
    (*_epoxy_glXMakeCurrent)(dpy,WVar2,lVar3,_epoxy_glXMakeCurrent);
    return;
  }
  make_glx_context_current_or_skip_cold_1();
  uStack_50 = extraout_RAX;
  pDStack_48 = dpy;
  lVar3 = (*_epoxy_glXGetFBConfigs)();
  if (lVar3 != 0) {
    if (0 < (int)uStack_50) {
      lVar5 = 0;
      do {
        iVar1 = (*_epoxy_glXGetFBConfigAttrib)
                          (pDVar4,*(undefined8 *)(lVar3 + lVar5 * 8),0x800b,(long)&uStack_50 + 4);
        if ((iVar1 == 0) && (uStack_50._4_4_ == (int)visinfo->visualid)) break;
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)uStack_50);
    }
    XFree(lVar3);
  }
  return;
}

Assistant:

void
make_glx_context_current_or_skip(Display *dpy)
{
	GLXContext ctx;
	XVisualInfo *visinfo = get_glx_visual(dpy);
	Window win = get_glx_window(dpy, visinfo, false);

	ctx = glXCreateContext(dpy, visinfo, False, True);
	if (ctx == None) {
		fprintf(stderr, "glXCreateContext failed\n");
		exit(1);
	}

	glXMakeCurrent(dpy, win, ctx);
}